

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  bool bVar1;
  Option *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pbVar4;
  CommandLine *pCVar5;
  ParseOptions options_00;
  uint uVar6;
  _List *p_Var7;
  void *pvVar8;
  ulong uVar9;
  ulong __n;
  iterator iVar10;
  iterator iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  runtime_error *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Rb_tree_color _Var14;
  long lVar15;
  basic_string_view<char,_std::char_traits<char>_> *__source;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s;
  path *this_02;
  size_type __rlen;
  __extent_storage<18446744073709551615UL> _Var16;
  string_view *psVar17;
  string_view sVar18;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view arg;
  bool hadUnknowns;
  string result;
  Option *expectingVal;
  string lookupStr;
  string expectingValName;
  char local_141;
  CommandLine *local_140;
  bool *local_138;
  ParseOptions local_12c;
  string local_128;
  Option *local_108;
  ulong local_100;
  path local_f8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c8;
  string local_c0;
  path local_a0;
  _Base_ptr local_78;
  _Base_ptr local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  _Base_ptr local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_58;
  string local_50;
  
  _Var16 = args._M_extent._M_extent_value;
  __source = args._M_ptr;
  local_140 = this;
  if ((this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"No options defined");
LAB_001ca8c0:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_12c = options;
  if (((uint)options >> 8 & 1) != 0) goto LAB_001ca264;
  if (_Var16._M_extent_value == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Expected at least one argument");
    goto LAB_001ca8c0;
  }
  this_02 = &local_a0;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (this_02,__source,auto_format);
  if (local_a0._M_pathname._M_string_length == 0) {
LAB_001ca226:
    std::filesystem::__cxx11::path::path(&local_f8);
  }
  else {
    uVar6 = (uint)local_a0._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl;
    if ((~(byte)local_a0._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl & 3) != 0) {
      if ((((ulong)local_a0._M_cmpts._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) &&
         (local_a0._M_pathname._M_dataplus._M_p[local_a0._M_pathname._M_string_length - 1] != '/'))
      {
        if (((ulong)local_a0._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          lVar15 = std::filesystem::__cxx11::path::_List::end();
          this_02 = (path *)(lVar15 + -0x30);
          p_Var7 = (_List *)(lVar15 + -0x10);
          if (((ulong)local_a0._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) != 0) {
            p_Var7 = &local_a0._M_cmpts;
            this_02 = &local_a0;
          }
          uVar6 = (uint)(_Impl *)(p_Var7->_M_impl)._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 .
                                 super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
          ;
        }
        else {
          this_02 = &local_a0;
        }
        if ((~uVar6 & 3) == 0) goto LAB_001ca217;
      }
      goto LAB_001ca226;
    }
LAB_001ca217:
    std::filesystem::__cxx11::path::path(&local_f8,this_02);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_140->programName,&local_f8._M_pathname);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::filesystem::__cxx11::path::~path(&local_a0);
  _Var16._M_extent_value = _Var16._M_extent_value - 1;
  __source = __source + 1;
LAB_001ca264:
  _Var14 = _S_red;
  local_108 = (Option *)0x0;
  local_a0._M_pathname._M_dataplus._M_p = (pointer)&local_a0._M_pathname.field_2;
  local_a0._M_pathname._M_string_length = 0;
  local_a0._M_pathname.field_2._M_local_buf[0] = '\0';
  local_141 = '\0';
  if (_Var16._M_extent_value != 0) {
    psVar17 = __source + _Var16._M_extent_value;
    local_d0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_140->errors;
    local_58 = &local_140->cmdIgnore;
    local_60 = &(local_140->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = &local_140->cmdRename;
    local_70 = &(local_140->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_138 = (bool *)((ulong)local_138 & 0xffffffff00000000);
    local_100 = 0;
    local_c8.values_ = (value<fmt::v11::context> *)0x0;
    do {
      if (_Var14 == _S_red) {
        __n = __source->_M_len;
        __s = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)__source->_M_str;
        sVar18 = *__source;
        if (local_108 == (Option *)0x0) {
          if ((__n < 2 || ((ulong)local_138 & 1) != 0) ||
             ((bVar1 = ((__s.values_)->field_0).bool_value, bVar1 != true && (bVar1 != true)))) {
            if (local_100 == 0) {
              local_100 = __n;
              local_c8 = __s;
            }
            this_00 = (local_140->positional).
                      super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            _Var14 = _S_red;
            if ((this_00 != (Option *)0x0) &&
               (Option::set_abi_cxx11_
                          (&local_50,this_00,(string_view)(ZEXT816(0x478002) << 0x40),*__source,
                           (bool)(local_12c.ignoreDuplicates & 1)), in_R9 = __s,
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50._M_dataplus._M_p != &local_50.field_2)) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
              in_R9 = __s;
            }
          }
          else {
            if ((__n == 2) && (*(short *)&(__s.values_)->field_0 == 0x2d2d)) {
              local_138 = (bool *)CONCAT44(local_138._4_4_,1);
              goto LAB_001ca3f1;
            }
            _Var14 = _S_red;
            if ((local_140->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
                (local_140->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_001ca70f:
              in_R9.values_ = (value<fmt::v11::context> *)&local_141;
              handleArg(local_140,sVar18,&local_108,&local_a0._M_pathname,(bool *)in_R9.values_,
                        local_12c);
            }
            else {
              if (bVar1 == true) {
                pvVar8 = memchr((bool *)((long)&(__s.values_)->field_0 + 1),0x2b,__n - 1);
                uVar9 = (long)pvVar8 - (long)__s;
                if (uVar9 == 0xffffffffffffffff || pvVar8 == (void *)0x0) goto LAB_001ca54c;
                if (__n < uVar9) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",uVar9,__n);
                }
LAB_001ca573:
                lVar15 = __n - uVar9;
                local_138 = (bool *)((long)&(__s.values_)->field_0 + uVar9);
                __n = uVar9;
              }
              else {
                pvVar8 = memchr(__s.values_,0x3d,__n);
                uVar9 = (long)pvVar8 - (long)__s;
                if (uVar9 != 0xffffffffffffffff && pvVar8 != (void *)0x0) {
                  if (__n < uVar9) {
                    std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > __size (which is %zu)",
                               "basic_string_view::substr",uVar9,__n);
                  }
                  goto LAB_001ca573;
                }
LAB_001ca54c:
                lVar15 = 0;
                local_138 = (bool *)0x0;
              }
              local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,__s.values_,
                         (bool *)((long)&(__s.values_)->field_0 + __n));
              iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(&local_58->_M_t,&local_f8._M_pathname);
              if (iVar10._M_node == local_60) {
                iVar11 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find(&local_68->_M_t,&local_f8._M_pathname);
                if (iVar11._M_node != local_70) {
                  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                  local_78 = iVar11._M_node;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c0,local_138,local_138 + lVar15);
                  pbVar12 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_c0,0,0,*(char **)(local_78 + 2),
                                    (size_type)local_78[2]._M_parent);
                  options_00 = local_12c;
                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar12->_M_dataplus)._M_p;
                  paVar13 = &pbVar12->field_2;
                  if (paVar2 == paVar13) {
                    local_128.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                  }
                  else {
                    local_128.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_128._M_dataplus._M_p = (pointer)paVar2;
                  }
                  local_128._M_string_length = pbVar12->_M_string_length;
                  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar12->_M_string_length = 0;
                  (pbVar12->field_2)._M_local_buf[0] = '\0';
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                    operator_delete(local_c0._M_dataplus._M_p,
                                    local_c0.field_2._M_allocated_capacity + 1);
                  }
                  in_R9.values_ = (value<fmt::v11::context> *)&local_141;
                  arg._M_str = local_128._M_dataplus._M_p;
                  arg._M_len = local_128._M_string_length;
                  handleArg(local_140,arg,&local_108,&local_a0._M_pathname,(bool *)in_R9.values_,
                            options_00);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                    operator_delete(local_128._M_dataplus._M_p,
                                    local_128.field_2._M_allocated_capacity + 1);
                  }
                  _Var14 = _S_red;
                  goto LAB_001ca6e8;
                }
                bVar1 = true;
                _Var14 = _S_red;
              }
              else {
                _Var14 = iVar10._M_node[2]._M_color;
LAB_001ca6e8:
                bVar1 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_pathname._M_dataplus._M_p != &local_f8._M_pathname.field_2) {
                operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                                (size_t)(local_f8._M_pathname.field_2._M_allocated_capacity + 1));
              }
              if (bVar1) goto LAB_001ca70f;
            }
            local_138 = (bool *)((ulong)local_138 & 0xffffffff00000000);
          }
        }
        else {
          sVar18._M_str = local_a0._M_pathname._M_dataplus._M_p;
          sVar18._M_len = local_a0._M_pathname._M_string_length;
          Option::set_abi_cxx11_
                    (&local_128,local_108,sVar18,*__source,(bool)(local_12c.ignoreDuplicates & 1));
          in_R9 = __s;
          if (local_128._M_string_length != 0) {
            local_f8._M_pathname._M_dataplus._M_p = (local_140->programName)._M_dataplus._M_p;
            local_f8._M_pathname._M_string_length = (local_140->programName)._M_string_length;
            local_f8._M_pathname.field_2._M_allocated_capacity =
                 (size_type)local_128._M_dataplus._M_p;
            local_f8._M_pathname.field_2._8_8_ = local_128._M_string_length;
            fmt.size_ = 0xdd;
            fmt.data_ = (char *)0x6;
            args_00.field_1.args_ = __s.args_;
            args_00.desc_ = (unsigned_long_long)&local_f8;
            ::fmt::v11::vformat_abi_cxx11_(&local_c0,(v11 *)"{}: {}",fmt,args_00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_d0,&local_c0);
            in_R9 = __s;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
              in_R9 = __s;
            }
          }
          local_108 = (Option *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
LAB_001ca3f1:
          _Var14 = _S_red;
        }
      }
      else {
        _Var14 = _Var14 - _S_black;
      }
      pCVar5 = local_140;
      __source = __source + 1;
    } while (__source != psVar17);
    if (local_108 != (Option *)0x0) {
      local_f8._M_pathname._M_dataplus._M_p = (local_140->programName)._M_dataplus._M_p;
      local_f8._M_pathname._M_string_length = (local_140->programName)._M_string_length;
      local_f8._M_pathname.field_2._M_allocated_capacity =
           (size_type)local_a0._M_pathname._M_dataplus._M_p;
      local_f8._M_pathname.field_2._8_8_ = local_a0._M_pathname._M_string_length;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = (char *)0x27;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_f8;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_128,(v11 *)"{}: no value provided for argument \'{}\'",fmt_00,args_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_d0,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((pCVar5->positional).
          super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) && (local_100 != 0)) && (local_141 == '\0')) {
      local_f8._M_pathname._M_dataplus._M_p = (local_140->programName)._M_dataplus._M_p;
      local_f8._M_pathname._M_string_length = (local_140->programName)._M_string_length;
      local_f8._M_pathname.field_2._M_allocated_capacity = (size_type)local_c8;
      local_f8._M_pathname.field_2._8_8_ = local_100;
      fmt_01.size_ = 0xdd;
      fmt_01.data_ = (char *)0x38;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&local_f8;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_128,(v11 *)"{}: positional arguments are not allowed (see e.g. \'{}\')",
                 fmt_01,args_02);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_d0,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pbVar3 = (local_140->errors).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (local_140->errors).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_pathname._M_dataplus._M_p != &local_a0._M_pathname.field_2) {
    operator_delete(local_a0._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_a0._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_a0._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  return pbVar3 == pbVar4;
}

Assistant:

bool CommandLine::parse(std::span<const std::string_view> args, ParseOptions options) {
    if (optionMap.empty())
        SLANG_THROW(std::runtime_error("No options defined"));

    if (!options.ignoreProgramName) {
        if (args.empty())
            SLANG_THROW(std::runtime_error("Expected at least one argument"));

        programName = getU8Str(fs::path(args[0]).filename());
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    std::string expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    std::string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature).
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip or translate.
        if (!cmdIgnore.empty() || !cmdRename.empty()) {
            std::string_view ignoreArg = arg;
            std::string_view remainder;
            if (arg[0] == '+') {
                // If we ignore a vendor command of the form +xx ,
                // we match on any +xx+yyy command as +yy is the command's argument.
                size_t plusIndex = arg.find_first_of('+', 1);
                if (plusIndex != std::string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex);
                    remainder = arg.substr(plusIndex);
                }
            }
            else {
                // Otherwise we look up to the first equals for the name to ignore.
                size_t equalsIndex = arg.find_first_of('=');
                if (equalsIndex != std::string_view::npos) {
                    ignoreArg = arg.substr(0, equalsIndex);
                    remainder = arg.substr(equalsIndex);
                }
            }

            auto lookupStr = std::string(ignoreArg);
            if (auto it = cmdIgnore.find(lookupStr); it != cmdIgnore.end()) {
                // If yes, find how many args to skip.
                skip = it->second;
                continue;
            }

            if (auto it = cmdRename.find(lookupStr); it != cmdRename.end()) {
                // If yes, rename argument.
                auto renamed = it->second + std::string(remainder);
                handleArg(renamed, expectingVal, expectingValName, hadUnknowns, options);
                continue;
            }
        }

        // Otherwise just handle the argument.
        handleArg(arg, expectingVal, expectingValName, hadUnknowns, options);
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}